

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

void duckdb::RadixSortLSD
               (BufferManager *buffer_manager,data_ptr_t *dataptr,idx_t *count,idx_t *col_offset,
               idx_t *row_width,idx_t *sorting_size)

{
  idx_t iVar1;
  idx_t iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  data_ptr_t pdVar5;
  byte *pbVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  data_ptr_t pdVar14;
  AllocatedData temp_block;
  idx_t counts [256];
  AllocatedData local_850;
  ulong local_838 [257];
  
  iVar4 = (*buffer_manager->_vptr_BufferManager[0x14])();
  iVar1 = *row_width;
  iVar2 = *count;
  pdVar5 = Allocator::AllocateData((Allocator *)CONCAT44(extraout_var,iVar4),iVar1 * iVar2);
  AllocatedData::AllocatedData
            (&local_850,(Allocator *)CONCAT44(extraout_var,iVar4),pdVar5,iVar1 * iVar2);
  uVar13 = *sorting_size;
  if (uVar13 != 0) {
    uVar11 = 1;
    bVar8 = false;
    do {
      switchD_00570541::default(local_838,0,0x800);
      pdVar14 = local_850.pointer;
      pdVar5 = *dataptr;
      if (bVar8) {
        pdVar14 = *dataptr;
        pdVar5 = local_850.pointer;
      }
      lVar12 = (uVar13 - uVar11) + *col_offset;
      uVar13 = *count;
      if (uVar13 != 0) {
        pbVar6 = pdVar5 + lVar12;
        iVar1 = *row_width;
        uVar9 = uVar13;
        do {
          local_838[*pbVar6] = local_838[*pbVar6] + 1;
          pbVar6 = pbVar6 + iVar1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      lVar7 = 1;
      uVar9 = local_838[0];
      uVar10 = local_838[0];
      do {
        uVar3 = local_838[lVar7];
        if (uVar10 <= uVar3) {
          uVar10 = uVar3;
        }
        uVar9 = uVar9 + uVar3;
        local_838[lVar7] = uVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x100);
      if (uVar10 != uVar13) {
        if (*count != 0) {
          pdVar5 = pdVar5 + (uVar13 - 1) * *row_width;
          uVar13 = 0;
          do {
            uVar9 = local_838[pdVar5[lVar12]];
            local_838[pdVar5[lVar12]] = uVar9 - 1;
            FastMemcpy(pdVar14 + (uVar9 - 1) * *row_width,pdVar5,*row_width);
            pdVar5 = pdVar5 + -*row_width;
            uVar13 = uVar13 + 1;
          } while (uVar13 < *count);
        }
        bVar8 = (bool)(bVar8 ^ 1);
      }
      uVar11 = uVar11 + 1;
      uVar13 = *sorting_size;
    } while (uVar11 <= uVar13);
    if (bVar8) {
      switchD_00b1522a::default(*dataptr,local_850.pointer,*row_width * *count);
    }
  }
  AllocatedData::~AllocatedData(&local_850);
  return;
}

Assistant:

void RadixSortLSD(BufferManager &buffer_manager, const data_ptr_t &dataptr, const idx_t &count, const idx_t &col_offset,
                  const idx_t &row_width, const idx_t &sorting_size) {
	auto temp_block = buffer_manager.GetBufferAllocator().Allocate(count * row_width);
	bool swap = false;

	idx_t counts[SortConstants::VALUES_PER_RADIX];
	for (idx_t r = 1; r <= sorting_size; r++) {
		// Init counts to 0
		memset(counts, 0, sizeof(counts));
		// Const some values for convenience
		const data_ptr_t source_ptr = swap ? temp_block.get() : dataptr;
		const data_ptr_t target_ptr = swap ? dataptr : temp_block.get();
		const idx_t offset = col_offset + sorting_size - r;
		// Collect counts
		data_ptr_t offset_ptr = source_ptr + offset;
		for (idx_t i = 0; i < count; i++) {
			counts[*offset_ptr]++;
			offset_ptr += row_width;
		}
		// Compute offsets from counts
		idx_t max_count = counts[0];
		for (idx_t val = 1; val < SortConstants::VALUES_PER_RADIX; val++) {
			max_count = MaxValue<idx_t>(max_count, counts[val]);
			counts[val] = counts[val] + counts[val - 1];
		}
		if (max_count == count) {
			continue;
		}
		// Re-order the data in temporary array
		data_ptr_t row_ptr = source_ptr + (count - 1) * row_width;
		for (idx_t i = 0; i < count; i++) {
			idx_t &radix_offset = --counts[*(row_ptr + offset)];
			FastMemcpy(target_ptr + radix_offset * row_width, row_ptr, row_width);
			row_ptr -= row_width;
		}
		swap = !swap;
	}
	// Move data back to original buffer (if it was swapped)
	if (swap) {
		memcpy(dataptr, temp_block.get(), count * row_width);
	}
}